

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  U32 UVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = (ms->cParams).chainLog;
  pBVar2 = (ms->window).base;
  uVar7 = (ulong)ms->nextToUpdate;
  uVar8 = (uint)((long)ip - (long)pBVar2);
  if (ms->nextToUpdate < uVar8) {
    pUVar3 = ms->hashTable;
    pUVar4 = ms->chainTable;
    cVar5 = (char)(ms->cParams).hashLog;
    do {
      switch((int)iend) {
      case 5:
        uVar10 = *(long *)(pBVar2 + uVar7) * -0x30e4432345000000;
        break;
      case 6:
        uVar10 = *(long *)(pBVar2 + uVar7) * -0x30e4432340650000;
        break;
      case 7:
        uVar10 = *(long *)(pBVar2 + uVar7) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar10 = *(long *)(pBVar2 + uVar7) * -0x30e44323485a9b9d;
        break;
      default:
        uVar10 = (ulong)((uint)(*(int *)(pBVar2 + uVar7) * -0x61c8864f) >> (0x20U - cVar5 & 0x1f));
        goto LAB_00207b67;
      }
      uVar10 = uVar10 >> (0x40U - cVar5 & 0x3f);
LAB_00207b67:
      UVar1 = pUVar3[uVar10];
      uVar9 = (ulong)(((uint)uVar7 & ~(-1 << ((char)uVar6 - 1U & 0x1f))) * 2);
      pUVar3[uVar10] = (uint)uVar7;
      pUVar4[uVar9] = UVar1;
      pUVar4[uVar9 + 1] = 1;
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((long)ip - (long)pBVar2 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar8;
  return;
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}